

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

void Gia_ManEdgeFromArray(Gia_Man_t *p,Vec_Int_t *vArray)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  Vec_Int_t *pVVar6;
  int *__s_00;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  pVVar5 = p->vEdge1;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vEdge1->pArray = (int *)0x0;
      pVVar5 = p->vEdge1;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_001f6b62;
    }
    free(pVVar5);
    p->vEdge1 = (Vec_Int_t *)0x0;
  }
LAB_001f6b62:
  pVVar5 = p->vEdge2;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vEdge2->pArray = (int *)0x0;
      pVVar5 = p->vEdge2;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_001f6baa;
    }
    free(pVVar5);
    p->vEdge2 = (Vec_Int_t *)0x0;
  }
LAB_001f6baa:
  iVar11 = p->nObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar8 = iVar11;
  }
  pVVar5->nCap = iVar8;
  if (iVar8 == 0) {
    __s_00 = (int *)0x0;
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar11;
    p->vEdge1 = pVVar5;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 0;
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar11;
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar8 << 2);
    pVVar5->pArray = __s;
    pVVar5->nSize = iVar11;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar11 * 4);
    }
    p->vEdge1 = pVVar5;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = iVar8;
    __s_00 = (int *)malloc((long)iVar8 << 2);
    pVVar6->pArray = __s_00;
    pVVar6->nSize = iVar11;
    if (__s_00 == (int *)0x0) {
      __s_00 = (int *)0x0;
    }
    else {
      memset(__s_00,0,(long)iVar11 << 2);
    }
  }
  p->vEdge2 = pVVar6;
  if (1 < vArray->nSize) {
    piVar3 = vArray->pArray;
    iVar8 = 0;
    lVar7 = 1;
    do {
      uVar1 = piVar3[lVar7 + -1];
      uVar2 = piVar3[lVar7];
      if ((int)uVar2 <= (int)uVar1) {
        __assert_fail("iObj1 < iObj2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                      ,0x51,"void Gia_ManEdgeFromArray(Gia_Man_t *, Vec_Int_t *)");
      }
      if (((int)uVar1 < 0) || (iVar11 <= (int)uVar1)) goto LAB_001f6d95;
      piVar4 = __s;
      if (__s[uVar1] == 0) {
LAB_001f6d14:
        piVar4[uVar1] = uVar2;
        iVar11 = pVVar5->nSize;
        iVar9 = 0;
      }
      else {
        if (pVVar6->nSize <= (int)uVar1) goto LAB_001f6d95;
        iVar9 = 1;
        piVar4 = __s_00;
        if (__s_00[uVar1] == 0) goto LAB_001f6d14;
      }
      if (iVar11 <= (int)uVar2) {
LAB_001f6d95:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = __s;
      if (__s[uVar2] == 0) {
LAB_001f6d4d:
        piVar4[uVar2] = uVar1;
        iVar10 = 0;
      }
      else {
        if (pVVar6->nSize <= (int)uVar2) goto LAB_001f6d95;
        iVar10 = 1;
        piVar4 = __s_00;
        if (__s_00[uVar2] == 0) goto LAB_001f6d4d;
      }
      iVar8 = iVar8 + iVar9 + iVar10;
      lVar7 = lVar7 + 2;
    } while ((int)lVar7 < vArray->nSize);
    if (iVar8 != 0) {
      printf("Found %d violations during edge conversion.\n");
      return;
    }
  }
  return;
}

Assistant:

void Gia_ManEdgeFromArray( Gia_Man_t * p, Vec_Int_t * vArray )
{
    int i, iObj1, iObj2, Count = 0;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_IntForEachEntryDouble( vArray, iObj1, iObj2, i )
    {
        assert( iObj1 < iObj2 );
        Count += Gia_ObjEdgeAdd( iObj1, iObj2, p->vEdge1, p->vEdge2 );
        Count += Gia_ObjEdgeAdd( iObj2, iObj1, p->vEdge1, p->vEdge2 );
    }
    if ( Count ) 
        printf( "Found %d violations during edge conversion.\n", Count );
}